

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O2

bool __thiscall henson::ProcMap::is_leader(ProcMap *this,int rank)

{
  pointer pLVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  
  pLVar1 = (this->levels_).
           super__Vector_base<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  p_Var3 = &pLVar1[-1].groups._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = pLVar1[-1].groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var2 != p_Var3 && (p_Var2[2]._M_color != rank));
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
  }
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool        is_leader(int rank) const                               { for (GroupMap::const_iterator it = level().groups.begin(); it != level().groups.end(); ++it) if (it->second.leader == rank) return true; return false; }